

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

CURLcode Curl_ssl_shutdown(connectdata *conn,int sockindex)

{
  undefined1 *puVar1;
  int iVar2;
  CURLcode CVar3;
  
  iVar2 = (*Curl_ssl->shut_down)(conn,sockindex);
  CVar3 = CURLE_SSL_SHUTDOWN_FAILED;
  if (iVar2 == 0) {
    puVar1 = &conn->ssl[sockindex].field_0x10;
    *puVar1 = *puVar1 & 0xfe;
    conn->ssl[sockindex].state = ssl_connection_none;
    conn->recv[sockindex] = Curl_recv_plain;
    conn->send[sockindex] = Curl_send_plain;
    CVar3 = CURLE_OK;
  }
  return CVar3;
}

Assistant:

CURLcode Curl_ssl_shutdown(struct connectdata *conn, int sockindex)
{
  if(Curl_ssl->shut_down(conn, sockindex))
    return CURLE_SSL_SHUTDOWN_FAILED;

  conn->ssl[sockindex].use = FALSE; /* get back to ordinary socket usage */
  conn->ssl[sockindex].state = ssl_connection_none;

  conn->recv[sockindex] = Curl_recv_plain;
  conn->send[sockindex] = Curl_send_plain;

  return CURLE_OK;
}